

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O2

void anon_unknown.dwarf_21ce4d::sha256::Round
               (uint32_t a,uint32_t b,uint32_t c,uint32_t *d,uint32_t e,uint32_t f,uint32_t g,
               uint32_t *h,uint32_t k)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = ((e << 7 | e >> 0x19) ^ (e << 0x15 | e >> 0xb) ^ (e << 0x1a | e >> 6)) + k +
          ((f ^ g) & e ^ g) + *h;
  *d = *d + iVar2;
  *h = ((b | a) & c | b & a) +
       ((a << 10 | a >> 0x16) ^ (a << 0x13 | a >> 0xd) ^ (a << 0x1e | a >> 2)) + iVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void inline Round(uint32_t a, uint32_t b, uint32_t c, uint32_t& d, uint32_t e, uint32_t f, uint32_t g, uint32_t& h, uint32_t k)
{
    uint32_t t1 = h + Sigma1(e) + Ch(e, f, g) + k;
    uint32_t t2 = Sigma0(a) + Maj(a, b, c);
    d += t1;
    h = t1 + t2;
}